

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesForm.cxx
# Opt level: O3

void cmCursesForm::LogMessage(char *msg)

{
  size_t sVar1;
  
  if (Debug) {
    if (msg == (char *)0x0) {
      std::ios::clear((int)DebugFile.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream[-3] + 0x5d1190);
    }
    else {
      sVar1 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>
                (&DebugFile.super_basic_ostream<char,_std::char_traits<char>_>,msg,sVar1);
    }
    std::ios::widen((char)DebugFile.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream[-3] + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void cmCursesForm::LogMessage(const char* msg)
{
  if (!cmCursesForm::Debug)
    {
    return;
    }

  cmCursesForm::DebugFile << msg << std::endl;
}